

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  float *pfVar3;
  float *pfVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long lVar36;
  ulong uVar37;
  long lVar38;
  int iVar39;
  long lVar40;
  unsigned_long uVar41;
  ulong uVar42;
  long lVar43;
  uint uVar44;
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar56;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar54;
  undefined1 auVar55 [16];
  float fVar57;
  undefined1 auVar58 [12];
  float fVar75;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar76;
  float fVar77;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 uVar78;
  float fVar89;
  float fVar90;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar105;
  undefined1 auVar106 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar114;
  undefined1 auVar115 [16];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar120 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  size_t local_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 auVar53 [16];
  undefined1 auVar65 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar41 = r->_begin;
  local_1f0 = 0;
  auVar98 = _DAT_01f45a40;
  aVar107 = _DAT_01f45a30;
  auVar110 = _DAT_01f45a40;
  aVar114 = _DAT_01f45a30;
  while( true ) {
    if (r->_end <= uVar41) {
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = aVar114;
      *(undefined1 (*) [16])
       (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
       field_0.m128 = auVar110;
      (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = aVar107;
      *(undefined1 (*) [16])
       (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
       field_0.m128 = auVar98;
      __return_storage_ptr__->end = local_1f0;
      return __return_storage_ptr__;
    }
    pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             vertices.items;
    uVar44 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                super_CurveGeometry.field_0x68 * uVar41);
    uVar42 = (ulong)uVar44;
    uVar37 = (ulong)(uVar44 + 1);
    if (uVar37 < (pBVar5->super_RawBufferView).num) break;
LAB_002266b4:
    uVar41 = uVar41 + 1;
  }
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  lVar43 = 0;
LAB_0022627d:
  if ((ulong)((this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.numTimeSteps - 1) * 0x38 + 0x70 == lVar43 + 0x38) {
    pcVar7 = (pBVar5->super_RawBufferView).ptr_ofs;
    sVar8 = (pBVar5->super_RawBufferView).stride;
    pfVar1 = (float *)(pcVar7 + sVar8 * uVar42);
    fVar121 = *pfVar1;
    fVar126 = pfVar1[1];
    fVar56 = pfVar1[2];
    pauVar2 = (undefined1 (*) [12])(pcVar7 + sVar8 * uVar37);
    fVar123 = *(float *)*pauVar2;
    fVar89 = *(float *)(*pauVar2 + 4);
    fVar90 = *(float *)(*pauVar2 + 8);
    pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
    sVar8 = (pBVar6->super_RawBufferView).stride;
    pfVar3 = (float *)(pcVar7 + uVar42 * sVar8);
    pfVar4 = (float *)(pcVar7 + sVar8 * uVar37);
    fVar135 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .maxRadiusScale;
    fVar91 = pfVar1[3] * fVar135;
    fVar105 = *(float *)pauVar2[1] * fVar135;
    fVar57 = *pfVar3 * 0.33333334 + fVar121;
    fVar75 = pfVar3[1] * 0.33333334 + fVar126;
    fVar76 = pfVar3[2] * 0.33333334 + fVar56;
    fVar77 = pfVar3[3] * fVar135 * 0.33333334 + fVar91;
    fVar132 = fVar123 - *pfVar4 * 0.33333334;
    fVar133 = fVar89 - pfVar4[1] * 0.33333334;
    fVar134 = fVar90 - pfVar4[2] * 0.33333334;
    fVar135 = fVar105 - pfVar4[3] * fVar135 * 0.33333334;
    iVar39 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             tessellationRate;
    lVar43 = (long)iVar39;
    if (lVar43 == 4) {
      auVar108._0_4_ =
           fVar121 * (float)bezier_basis0._272_4_ +
           fVar57 * (float)bezier_basis0._1428_4_ +
           fVar132 * (float)bezier_basis0._2584_4_ + fVar123 * (float)bezier_basis0._3740_4_;
      auVar108._4_4_ =
           fVar121 * (float)bezier_basis0._276_4_ +
           fVar57 * (float)bezier_basis0._1432_4_ +
           fVar132 * (float)bezier_basis0._2588_4_ + fVar123 * (float)bezier_basis0._3744_4_;
      auVar108._8_4_ =
           fVar121 * (float)bezier_basis0._280_4_ +
           fVar57 * (float)bezier_basis0._1436_4_ +
           fVar132 * (float)bezier_basis0._2592_4_ + fVar123 * (float)bezier_basis0._3748_4_;
      auVar108._12_4_ =
           fVar121 * (float)bezier_basis0._284_4_ +
           fVar57 * (float)bezier_basis0._1440_4_ +
           fVar132 * (float)bezier_basis0._2596_4_ + fVar123 * (float)bezier_basis0._3752_4_;
      fVar121 = fVar126 * (float)bezier_basis0._272_4_ +
                fVar75 * (float)bezier_basis0._1428_4_ +
                fVar133 * (float)bezier_basis0._2584_4_ + fVar89 * (float)bezier_basis0._3740_4_;
      fVar123 = fVar126 * (float)bezier_basis0._276_4_ +
                fVar75 * (float)bezier_basis0._1432_4_ +
                fVar133 * (float)bezier_basis0._2588_4_ + fVar89 * (float)bezier_basis0._3744_4_;
      fVar57 = fVar126 * (float)bezier_basis0._280_4_ +
               fVar75 * (float)bezier_basis0._1436_4_ +
               fVar133 * (float)bezier_basis0._2592_4_ + fVar89 * (float)bezier_basis0._3748_4_;
      fVar126 = fVar126 * (float)bezier_basis0._284_4_ +
                fVar75 * (float)bezier_basis0._1440_4_ +
                fVar133 * (float)bezier_basis0._2596_4_ + fVar89 * (float)bezier_basis0._3752_4_;
      auVar136._0_4_ =
           fVar56 * (float)bezier_basis0._272_4_ +
           fVar76 * (float)bezier_basis0._1428_4_ +
           fVar134 * (float)bezier_basis0._2584_4_ + fVar90 * (float)bezier_basis0._3740_4_;
      auVar136._4_4_ =
           fVar56 * (float)bezier_basis0._276_4_ +
           fVar76 * (float)bezier_basis0._1432_4_ +
           fVar134 * (float)bezier_basis0._2588_4_ + fVar90 * (float)bezier_basis0._3744_4_;
      auVar136._8_4_ =
           fVar56 * (float)bezier_basis0._280_4_ +
           fVar76 * (float)bezier_basis0._1436_4_ +
           fVar134 * (float)bezier_basis0._2592_4_ + fVar90 * (float)bezier_basis0._3748_4_;
      auVar136._12_4_ =
           fVar56 * (float)bezier_basis0._284_4_ +
           fVar76 * (float)bezier_basis0._1440_4_ +
           fVar134 * (float)bezier_basis0._2596_4_ + fVar90 * (float)bezier_basis0._3752_4_;
      auVar63._0_8_ = CONCAT44(auVar108._0_4_,auVar108._4_4_);
      auVar63._8_4_ = auVar108._12_4_;
      auVar63._12_4_ = auVar108._8_4_;
      auVar50._8_4_ = auVar108._12_4_;
      auVar50._0_8_ = auVar63._0_8_;
      auVar50._12_4_ = auVar108._8_4_;
      auVar51 = minps(auVar50,auVar108);
      auVar92._0_8_ = auVar51._8_8_;
      auVar92._8_4_ = auVar51._0_4_;
      auVar92._12_4_ = auVar51._4_4_;
      auVar93 = minps(auVar92,auVar51);
      auVar106._0_8_ = CONCAT44(fVar121,fVar123);
      auVar106._8_4_ = fVar126;
      auVar106._12_4_ = fVar57;
      auVar111._8_4_ = fVar126;
      auVar111._0_8_ = auVar106._0_8_;
      auVar111._12_4_ = fVar57;
      auVar11._4_4_ = fVar123;
      auVar11._0_4_ = fVar121;
      auVar11._8_4_ = fVar57;
      auVar11._12_4_ = fVar126;
      auVar51 = minps(auVar111,auVar11);
      auVar52._0_8_ = auVar51._8_8_;
      auVar52._8_4_ = auVar51._0_4_;
      auVar52._12_4_ = auVar51._4_4_;
      auVar51 = minps(auVar52,auVar51);
      auVar94._0_8_ = CONCAT44(auVar136._0_4_,auVar136._4_4_);
      auVar94._8_4_ = auVar136._12_4_;
      auVar94._12_4_ = auVar136._8_4_;
      auVar112._8_4_ = auVar136._12_4_;
      auVar112._0_8_ = auVar94._0_8_;
      auVar112._12_4_ = auVar136._8_4_;
      auVar113 = minps(auVar112,auVar136);
      auVar120._0_8_ = auVar113._8_8_;
      auVar120._8_4_ = auVar113._0_4_;
      auVar120._12_4_ = auVar113._4_4_;
      auVar113 = minps(auVar120,auVar113);
      auVar45._4_4_ = auVar51._0_4_;
      auVar45._0_4_ = auVar93._0_4_;
      auVar45._8_4_ = auVar113._0_4_;
      auVar51 = maxps(auVar63,auVar108);
      auVar109._0_8_ = auVar51._8_8_;
      auVar109._8_4_ = auVar51._0_4_;
      auVar109._12_4_ = auVar51._4_4_;
      auVar113 = maxps(auVar109,auVar51);
      auVar12._4_4_ = fVar123;
      auVar12._0_4_ = fVar121;
      auVar12._8_4_ = fVar57;
      auVar12._12_4_ = fVar126;
      auVar51 = maxps(auVar106,auVar12);
      auVar64._0_8_ = auVar51._8_8_;
      auVar64._8_4_ = auVar51._0_4_;
      auVar64._12_4_ = auVar51._4_4_;
      auVar51 = maxps(auVar64,auVar51);
      auVar93 = maxps(auVar94,auVar136);
      auVar79._0_8_ = auVar93._8_8_;
      auVar79._8_4_ = auVar93._0_4_;
      auVar79._12_4_ = auVar93._4_4_;
      auVar93 = maxps(auVar79,auVar93);
      auVar58._4_4_ = auVar51._0_4_;
      auVar58._0_4_ = auVar113._0_4_;
      auVar58._8_4_ = auVar93._0_4_;
      local_1b8._0_8_ =
           CONCAT44(fVar91 * (float)bezier_basis0._276_4_ +
                    fVar77 * (float)bezier_basis0._1432_4_ +
                    fVar135 * (float)bezier_basis0._2588_4_ +
                    fVar105 * (float)bezier_basis0._3744_4_,
                    fVar91 * (float)bezier_basis0._272_4_ +
                    fVar77 * (float)bezier_basis0._1428_4_ +
                    fVar135 * (float)bezier_basis0._2584_4_ +
                    fVar105 * (float)bezier_basis0._3740_4_) & 0x7fffffff7fffffff;
      local_1b8._8_4_ =
           ABS(fVar91 * (float)bezier_basis0._280_4_ +
               fVar77 * (float)bezier_basis0._1436_4_ +
               fVar135 * (float)bezier_basis0._2592_4_ + fVar105 * (float)bezier_basis0._3748_4_);
      local_1b8._12_4_ =
           ABS(fVar91 * (float)bezier_basis0._284_4_ +
               fVar77 * (float)bezier_basis0._1440_4_ +
               fVar135 * (float)bezier_basis0._2596_4_ + fVar105 * (float)bezier_basis0._3752_4_);
    }
    else {
      lVar38 = lVar43 * 0x44;
      local_1b8 = (undefined1  [16])0x0;
      lVar36 = 0;
      local_1e8._8_8_ = 0x7f8000007f800000;
      local_1e8._0_8_ = 0x7f8000007f800000;
      local_1d8 = 0x7f800000;
      uStack_1d4 = 0x7f800000;
      uStack_1d0 = 0x7f800000;
      uStack_1cc = 0x7f800000;
      local_1c8 = 0x7f800000;
      uStack_1c4 = 0x7f800000;
      uStack_1c0 = 0x7f800000;
      uStack_1bc = 0x7f800000;
      auVar51 = _DAT_01f45a40;
      auVar93 = _DAT_01f45a40;
      auVar113 = _DAT_01f45a40;
      while( true ) {
        if (lVar43 <= lVar36) break;
        uVar44 = (uint)lVar36;
        auVar137._0_4_ = -(uint)((int)uVar44 < iVar39);
        auVar137._4_4_ = -(uint)((int)(uVar44 | 1) < iVar39);
        auVar137._8_4_ = -(uint)((int)(uVar44 | 2) < iVar39);
        auVar137._12_4_ = -(uint)((int)(uVar44 | 3) < iVar39);
        pfVar1 = (float *)(lVar38 + 0x21fbbec + lVar36 * 4);
        fVar17 = *pfVar1;
        fVar18 = pfVar1[1];
        fVar19 = pfVar1[2];
        fVar20 = pfVar1[3];
        pfVar1 = (float *)(lVar38 + 0x21fc070 + lVar36 * 4);
        fVar21 = *pfVar1;
        fVar22 = pfVar1[1];
        fVar23 = pfVar1[2];
        fVar24 = pfVar1[3];
        pfVar1 = (float *)(lVar38 + 0x21fb768 + lVar36 * 4);
        fVar25 = *pfVar1;
        fVar26 = pfVar1[1];
        fVar27 = pfVar1[2];
        fVar28 = pfVar1[3];
        pfVar1 = (float *)(bezier_basis0 + lVar36 * 4 + lVar38);
        fVar29 = *pfVar1;
        fVar30 = pfVar1[1];
        fVar31 = pfVar1[2];
        fVar32 = pfVar1[3];
        fVar128 = fVar121 * fVar29 + fVar57 * fVar25 + fVar132 * fVar17 + fVar123 * fVar21;
        fVar129 = fVar121 * fVar30 + fVar57 * fVar26 + fVar132 * fVar18 + fVar123 * fVar22;
        fVar130 = fVar121 * fVar31 + fVar57 * fVar27 + fVar132 * fVar19 + fVar123 * fVar23;
        fVar131 = fVar121 * fVar32 + fVar57 * fVar28 + fVar132 * fVar20 + fVar123 * fVar24;
        fVar122 = fVar126 * fVar29 + fVar75 * fVar25 + fVar133 * fVar17 + fVar89 * fVar21;
        fVar124 = fVar126 * fVar30 + fVar75 * fVar26 + fVar133 * fVar18 + fVar89 * fVar22;
        fVar125 = fVar126 * fVar31 + fVar75 * fVar27 + fVar133 * fVar19 + fVar89 * fVar23;
        fVar127 = fVar126 * fVar32 + fVar75 * fVar28 + fVar133 * fVar20 + fVar89 * fVar24;
        fVar116 = fVar56 * fVar29 + fVar76 * fVar25 + fVar134 * fVar17 + fVar90 * fVar21;
        fVar117 = fVar56 * fVar30 + fVar76 * fVar26 + fVar134 * fVar18 + fVar90 * fVar22;
        fVar118 = fVar56 * fVar31 + fVar76 * fVar27 + fVar134 * fVar19 + fVar90 * fVar23;
        fVar119 = fVar56 * fVar32 + fVar76 * fVar28 + fVar134 * fVar20 + fVar90 * fVar24;
        auVar15._4_4_ = fVar129;
        auVar15._0_4_ = fVar128;
        auVar15._8_4_ = fVar130;
        auVar15._12_4_ = fVar131;
        auVar83 = minps(local_1e8,auVar15);
        auVar84._0_4_ = auVar83._0_4_ & auVar137._0_4_;
        auVar84._4_4_ = auVar83._4_4_ & auVar137._4_4_;
        auVar84._8_4_ = auVar83._8_4_ & auVar137._8_4_;
        auVar84._12_4_ = auVar83._12_4_ & auVar137._12_4_;
        local_1e8 = auVar84 | ~auVar137 & local_1e8;
        auVar33._4_4_ = uStack_1d4;
        auVar33._0_4_ = local_1d8;
        auVar33._8_4_ = uStack_1d0;
        auVar33._12_4_ = uStack_1cc;
        auVar13._4_4_ = fVar124;
        auVar13._0_4_ = fVar122;
        auVar13._8_4_ = fVar125;
        auVar13._12_4_ = fVar127;
        auVar83 = minps(auVar33,auVar13);
        local_1d8 = auVar83._0_4_ & auVar137._0_4_ | ~auVar137._0_4_ & local_1d8;
        uStack_1d4 = auVar83._4_4_ & auVar137._4_4_ | ~auVar137._4_4_ & uStack_1d4;
        uStack_1d0 = auVar83._8_4_ & auVar137._8_4_ | ~auVar137._8_4_ & uStack_1d0;
        uStack_1cc = auVar83._12_4_ & auVar137._12_4_ | ~auVar137._12_4_ & uStack_1cc;
        auVar34._4_4_ = uStack_1c4;
        auVar34._0_4_ = local_1c8;
        auVar34._8_4_ = uStack_1c0;
        auVar34._12_4_ = uStack_1bc;
        auVar9._4_4_ = fVar117;
        auVar9._0_4_ = fVar116;
        auVar9._8_4_ = fVar118;
        auVar9._12_4_ = fVar119;
        auVar83 = minps(auVar34,auVar9);
        local_1c8 = auVar83._0_4_ & auVar137._0_4_ | ~auVar137._0_4_ & local_1c8;
        uStack_1c4 = auVar83._4_4_ & auVar137._4_4_ | ~auVar137._4_4_ & uStack_1c4;
        uStack_1c0 = auVar83._8_4_ & auVar137._8_4_ | ~auVar137._8_4_ & uStack_1c0;
        uStack_1bc = auVar83._12_4_ & auVar137._12_4_ | ~auVar137._12_4_ & uStack_1bc;
        auVar99._0_4_ = ~auVar137._0_4_ & auVar51._0_4_;
        auVar99._4_4_ = ~auVar137._4_4_ & auVar51._4_4_;
        auVar99._8_4_ = ~auVar137._8_4_ & auVar51._8_4_;
        auVar99._12_4_ = ~auVar137._12_4_ & auVar51._12_4_;
        auVar16._4_4_ = fVar129;
        auVar16._0_4_ = fVar128;
        auVar16._8_4_ = fVar130;
        auVar16._12_4_ = fVar131;
        auVar83 = maxps(auVar51,auVar16);
        auVar51._0_4_ = auVar83._0_4_ & auVar137._0_4_;
        auVar51._4_4_ = auVar83._4_4_ & auVar137._4_4_;
        auVar51._8_4_ = auVar83._8_4_ & auVar137._8_4_;
        auVar51._12_4_ = auVar83._12_4_ & auVar137._12_4_;
        auVar51 = auVar51 | auVar99;
        auVar100._0_4_ = ~auVar137._0_4_ & auVar113._0_4_;
        auVar100._4_4_ = ~auVar137._4_4_ & auVar113._4_4_;
        auVar100._8_4_ = ~auVar137._8_4_ & auVar113._8_4_;
        auVar100._12_4_ = ~auVar137._12_4_ & auVar113._12_4_;
        auVar14._4_4_ = fVar124;
        auVar14._0_4_ = fVar122;
        auVar14._8_4_ = fVar125;
        auVar14._12_4_ = fVar127;
        auVar83 = maxps(auVar113,auVar14);
        auVar113._0_4_ = auVar83._0_4_ & auVar137._0_4_;
        auVar113._4_4_ = auVar83._4_4_ & auVar137._4_4_;
        auVar113._8_4_ = auVar83._8_4_ & auVar137._8_4_;
        auVar113._12_4_ = auVar83._12_4_ & auVar137._12_4_;
        auVar113 = auVar113 | auVar100;
        auVar101._0_4_ = ~auVar137._0_4_ & auVar93._0_4_;
        auVar101._4_4_ = ~auVar137._4_4_ & auVar93._4_4_;
        auVar101._8_4_ = ~auVar137._8_4_ & auVar93._8_4_;
        auVar101._12_4_ = ~auVar137._12_4_ & auVar93._12_4_;
        auVar10._4_4_ = fVar117;
        auVar10._0_4_ = fVar116;
        auVar10._8_4_ = fVar118;
        auVar10._12_4_ = fVar119;
        auVar83 = maxps(auVar93,auVar10);
        auVar93._0_4_ = auVar83._0_4_ & auVar137._0_4_;
        auVar93._4_4_ = auVar83._4_4_ & auVar137._4_4_;
        auVar93._8_4_ = auVar83._8_4_ & auVar137._8_4_;
        auVar93._12_4_ = auVar83._12_4_ & auVar137._12_4_;
        auVar93 = auVar93 | auVar101;
        auVar115._0_8_ =
             CONCAT44(fVar30 * fVar91 + fVar26 * fVar77 + fVar18 * fVar135 + fVar22 * fVar105,
                      fVar29 * fVar91 + fVar25 * fVar77 + fVar17 * fVar135 + fVar21 * fVar105) &
             0x7fffffff7fffffff;
        auVar115._8_4_ =
             ABS(fVar31 * fVar91 + fVar27 * fVar77 + fVar19 * fVar135 + fVar23 * fVar105);
        auVar115._12_4_ =
             ABS(fVar32 * fVar91 + fVar28 * fVar77 + fVar20 * fVar135 + fVar24 * fVar105);
        auVar83 = maxps(local_1b8,auVar115);
        auVar102._0_4_ = auVar83._0_4_ & auVar137._0_4_;
        auVar102._4_4_ = auVar83._4_4_ & auVar137._4_4_;
        auVar102._8_4_ = auVar83._8_4_ & auVar137._8_4_;
        auVar102._12_4_ = auVar83._12_4_ & auVar137._12_4_;
        auVar138._0_4_ = ~auVar137._0_4_ & local_1b8._0_4_;
        auVar138._4_4_ = ~auVar137._4_4_ & local_1b8._4_4_;
        auVar138._8_4_ = ~auVar137._8_4_ & local_1b8._8_4_;
        auVar138._12_4_ = ~auVar137._12_4_ & local_1b8._12_4_;
        local_1b8 = auVar138 | auVar102;
        lVar36 = lVar36 + 4;
      }
      auVar70._4_4_ = local_1e8._0_4_;
      auVar70._0_4_ = local_1e8._4_4_;
      auVar70._8_4_ = local_1e8._12_4_;
      auVar70._12_4_ = local_1e8._8_4_;
      auVar83 = minps(auVar70,local_1e8);
      auVar69._0_8_ = auVar83._8_8_;
      auVar69._8_4_ = auVar83._0_4_;
      auVar69._12_4_ = auVar83._4_4_;
      auVar70 = minps(auVar69,auVar83);
      auVar83._4_4_ = uStack_1d4;
      auVar83._0_4_ = local_1d8;
      auVar83._8_4_ = uStack_1d0;
      auVar83._12_4_ = uStack_1cc;
      auVar85._4_4_ = local_1d8;
      auVar85._0_4_ = uStack_1d4;
      auVar85._8_4_ = uStack_1cc;
      auVar85._12_4_ = uStack_1d0;
      auVar83 = minps(auVar85,auVar83);
      auVar55._0_8_ = auVar83._8_8_;
      auVar55._8_4_ = auVar83._0_4_;
      auVar55._12_4_ = auVar83._4_4_;
      auVar83 = minps(auVar55,auVar83);
      auVar72._4_4_ = uStack_1c4;
      auVar72._0_4_ = local_1c8;
      auVar72._8_4_ = uStack_1c0;
      auVar72._12_4_ = uStack_1bc;
      auVar71._4_4_ = local_1c8;
      auVar71._0_4_ = uStack_1c4;
      auVar71._8_4_ = uStack_1bc;
      auVar71._12_4_ = uStack_1c0;
      auVar72 = minps(auVar71,auVar72);
      auVar86._0_8_ = auVar72._8_8_;
      auVar86._8_4_ = auVar72._0_4_;
      auVar86._12_4_ = auVar72._4_4_;
      auVar72 = minps(auVar86,auVar72);
      auVar45._4_4_ = auVar83._0_4_;
      auVar45._0_4_ = auVar70._0_4_;
      auVar45._8_4_ = auVar72._0_4_;
      auVar73._4_4_ = auVar51._0_4_;
      auVar73._0_4_ = auVar51._4_4_;
      auVar73._8_4_ = auVar51._12_4_;
      auVar73._12_4_ = auVar51._8_4_;
      auVar51 = maxps(auVar73,auVar51);
      auVar87._0_8_ = auVar51._8_8_;
      auVar87._8_4_ = auVar51._0_4_;
      auVar87._12_4_ = auVar51._4_4_;
      auVar83 = maxps(auVar87,auVar51);
      auVar103._4_4_ = auVar113._0_4_;
      auVar103._0_4_ = auVar113._4_4_;
      auVar103._8_4_ = auVar113._12_4_;
      auVar103._12_4_ = auVar113._8_4_;
      auVar51 = maxps(auVar103,auVar113);
      auVar74._0_8_ = auVar51._8_8_;
      auVar74._8_4_ = auVar51._0_4_;
      auVar74._12_4_ = auVar51._4_4_;
      auVar51 = maxps(auVar74,auVar51);
      auVar88._4_4_ = auVar93._0_4_;
      auVar88._0_4_ = auVar93._4_4_;
      auVar88._8_4_ = auVar93._12_4_;
      auVar88._12_4_ = auVar93._8_4_;
      auVar93 = maxps(auVar88,auVar93);
      auVar104._0_8_ = auVar93._8_8_;
      auVar104._8_4_ = auVar93._0_4_;
      auVar104._12_4_ = auVar93._4_4_;
      auVar93 = maxps(auVar104,auVar93);
      auVar58._4_4_ = auVar51._0_4_;
      auVar58._0_4_ = auVar83._0_4_;
      auVar58._8_4_ = auVar93._0_4_;
    }
    auVar65._12_4_ = 0;
    auVar65._0_12_ = auVar58;
    auVar53._12_4_ = 0;
    auVar53._0_12_ = auVar45;
    auVar80._4_4_ = local_1b8._0_4_;
    auVar80._0_4_ = local_1b8._4_4_;
    auVar80._8_4_ = local_1b8._12_4_;
    auVar80._12_4_ = local_1b8._8_4_;
    auVar51 = maxps(auVar80,local_1b8);
    uVar78 = auVar51._0_4_;
    auVar81._8_4_ = auVar51._8_4_;
    auVar95._4_4_ = uVar78;
    auVar95._0_4_ = uVar78;
    auVar95._8_4_ = uVar78;
    auVar95._12_4_ = uVar78;
    auVar81._4_4_ = auVar81._8_4_;
    auVar81._0_4_ = auVar81._8_4_;
    auVar81._12_4_ = auVar81._8_4_;
    auVar113 = maxps(auVar81,auVar95);
    auVar35._12_4_ = fVar105;
    auVar35._0_12_ = *pauVar2;
    auVar51 = minps(auVar53,auVar35);
    auVar93 = maxps(auVar65,auVar35);
    auVar96._0_8_ = CONCAT44(fVar105,fVar105) & 0x7fffffff7fffffff;
    auVar96._8_4_ = ABS(fVar105);
    auVar96._12_4_ = ABS(fVar105);
    auVar113 = maxps(auVar113,auVar96);
    fVar121 = auVar51._0_4_ - auVar113._0_4_;
    fVar126 = auVar51._4_4_ - auVar113._4_4_;
    fVar56 = auVar51._8_4_ - auVar113._8_4_;
    fVar123 = auVar113._0_4_ + auVar93._0_4_;
    fVar89 = auVar113._4_4_ + auVar93._4_4_;
    fVar90 = auVar113._8_4_ + auVar93._8_4_;
    auVar66._0_8_ = CONCAT44(fVar126,fVar121) & 0x7fffffff7fffffff;
    auVar66._8_4_ = ABS(fVar56);
    auVar66._12_4_ = ABS(auVar51._12_4_ - auVar113._12_4_);
    auVar97._0_8_ = CONCAT44(fVar89,fVar123) & 0x7fffffff7fffffff;
    auVar97._8_4_ = ABS(fVar90);
    auVar97._12_4_ = ABS(auVar113._12_4_ + auVar93._12_4_);
    auVar51 = maxps(auVar66,auVar97);
    fVar135 = auVar51._4_4_;
    if (auVar51._4_4_ <= auVar51._0_4_) {
      fVar135 = auVar51._0_4_;
    }
    auVar67._8_8_ = auVar51._8_8_;
    auVar67._0_8_ = auVar51._8_8_;
    if (auVar51._8_4_ <= fVar135) {
      auVar67._0_4_ = fVar135;
    }
    fVar135 = auVar67._0_4_ * 4.7683716e-07;
    aVar54._0_4_ = fVar121 - fVar135;
    aVar54._4_4_ = fVar126 - fVar135;
    aVar54._8_4_ = fVar56 - fVar135;
    aVar68._0_4_ = fVar135 + fVar123;
    aVar68._4_4_ = fVar135 + fVar89;
    aVar68._8_4_ = fVar135 + fVar90;
    aVar54.m128[3] = (float)geomID;
    aVar68.m128[3] = (float)uVar41;
    aVar114.m128 = (__m128)minps(aVar114.m128,aVar54.m128);
    auVar110 = maxps(auVar110,(undefined1  [16])aVar68);
    auVar82._0_4_ = aVar54._0_4_ + aVar68._0_4_;
    auVar82._4_4_ = aVar54._4_4_ + aVar68._4_4_;
    auVar82._8_4_ = aVar54._8_4_ + aVar68._8_4_;
    auVar82._12_4_ = (float)geomID + (float)uVar41;
    aVar107.m128 = (__m128)minps(aVar107.m128,auVar82);
    auVar98 = maxps(auVar98,auVar82);
    local_1f0 = local_1f0 + 1;
    prims[k].lower.field_0 = aVar54;
    prims[k].upper.field_0 = aVar68;
    k = k + 1;
  }
  else {
    lVar38 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar43);
    lVar36 = *(long *)((long)&(pBVar5->super_RawBufferView).stride + lVar43);
    lVar40 = lVar36 * uVar42;
    pfVar1 = (float *)(lVar38 + lVar40);
    auVar59._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
    auVar59._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
    auVar59._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
    auVar59._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
    auVar46._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
    auVar46._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
    auVar46._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
    auVar46._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
    iVar39 = movmskps((int)lVar40,auVar46 | auVar59);
    if (iVar39 == 0) {
      lVar36 = lVar36 * uVar37;
      pfVar1 = (float *)(lVar38 + lVar36);
      auVar60._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
      auVar60._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
      auVar60._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
      auVar60._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
      auVar47._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
      auVar47._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
      auVar47._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
      auVar47._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
      iVar39 = movmskps((int)lVar36,auVar47 | auVar60);
      if (iVar39 == 0) {
        lVar38 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar43);
        lVar36 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar43);
        lVar40 = lVar36 * uVar42;
        pfVar1 = (float *)(lVar38 + lVar40);
        auVar61._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
        auVar61._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
        auVar61._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
        auVar61._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
        auVar48._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
        auVar48._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
        auVar48._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
        auVar48._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
        iVar39 = movmskps((int)lVar40,auVar48 | auVar61);
        if (iVar39 == 0) goto code_r0x0022630e;
      }
    }
  }
  goto LAB_002266b4;
code_r0x0022630e:
  pfVar1 = (float *)(lVar38 + lVar36 * uVar37);
  auVar62._4_4_ = -(uint)(pfVar1[1] <= -1.844e+18);
  auVar62._0_4_ = -(uint)(*pfVar1 <= -1.844e+18);
  auVar62._8_4_ = -(uint)(pfVar1[2] <= -1.844e+18);
  auVar62._12_4_ = -(uint)(pfVar1[3] <= -1.844e+18);
  auVar49._4_4_ = -(uint)(1.844e+18 <= pfVar1[1]);
  auVar49._0_4_ = -(uint)(1.844e+18 <= *pfVar1);
  auVar49._8_4_ = -(uint)(1.844e+18 <= pfVar1[2]);
  auVar49._12_4_ = -(uint)(1.844e+18 <= pfVar1[3]);
  iVar39 = movmskps(0,auVar49 | auVar62);
  lVar43 = lVar43 + 0x38;
  if (iVar39 != 0) goto LAB_002266b4;
  goto LAB_0022627d;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }